

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int main(int argc,char **argv)

{
  khalfflag_t *pkVar1;
  byte bVar2;
  PlatformApi *pPVar3;
  kArray *pkVar4;
  _func_kString_ptr_KonohaContext_ptr_kArray_ptr_char_ptr_size_t_int *p_Var5;
  _func_void_KonohaContext_ptr_kArray_ptr_void_ptr *p_Var6;
  _func_kbool_t_KonohaContext_ptr_kNameSpace_ptr_char_ptr_ptr_KTraceInfo_ptr *p_Var7;
  _func_void_KonohaContext_ptr_KBuffer_ptr_char_ptr_size_t *p_Var8;
  _func_int_char_ptr *p_Var9;
  KRuntimeContextVar *pKVar10;
  _func_int_char_ptr_varargs *p_Var11;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var12;
  char cVar13;
  int iVar14;
  char *pcVar15;
  KonohaContext *kctx;
  size_t sVar16;
  kString *pkVar17;
  kNameSpace *pkVar18;
  kfileline_t kVar19;
  uintptr_t uVar20;
  uint uVar21;
  long lVar22;
  ktypeattr_t ty;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong local_480;
  KBuffer local_478;
  kObject_conflict *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  char **local_440;
  kObject_conflict *local_438;
  KClass *local_430;
  size_t local_428;
  long local_420;
  KTraceInfo local_418;
  KonohaFactory factory;
  
  memset(&factory,0,0x3d0);
  pcVar15 = getenv("KONOHA_DEBUG");
  if (pcVar15 != (char *)0x0) {
    factory.verbose_debug = 1;
    factory.verbose_sugar = 1;
    factory.verbose_code = 1;
  }
  KonohaFactory_SetDefaultFactory(&factory,PosixFactory,argc,argv);
  kctx = (KonohaContext *)KonohaFactory_CreateKonoha(&factory);
  local_418.baseStack = kctx->esp + 4;
  local_418.pline = 0;
  local_418.errorSymbol = 0;
  local_418.faultType = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                local_478.m = (KGrowingArray *)((ulong)local_478.m & 0xffffffff00000000);
                iVar14 = getopt_long(argc,argv,"icqD:I:M:S:f:",long_options2,&local_478);
              } while (iVar14 == 0x3f);
              if (iVar14 != 0x44) break;
              CommandLine_Define(kctx,_optarg,&local_418);
            }
            if (iVar14 != 0x49) break;
            CommandLine_Import(kctx,_optarg,&local_418);
          }
          if (iVar14 != 0x4d) break;
          if ((_optarg != (char *)0x0) && (iVar14 = strcmp(_optarg,"OutputTest"), iVar14 == 0)) {
            pkVar1 = &kctx->stack->flag;
            *pkVar1 = *pkVar1 | 1;
            pPVar3 = kctx->platApi;
            pPVar3->verbose_debug = 0;
            pPVar3->verbose_sugar = 0;
            pPVar3->verbose_code = 0;
          }
        }
        if (iVar14 != 99) break;
        pkVar1 = &kctx->stack->flag;
        *pkVar1 = *pkVar1 | 4;
      }
      if (iVar14 != 0x69) break;
      interactive_flag = '\x01';
      pkVar1 = &kctx->stack->flag;
      *pkVar1 = *pkVar1 | 2;
    }
    if (iVar14 != 0x71) break;
    fprintf(_stdout,"%s-%lu\n","3.0",0x1082b);
    (*kctx->platApi->exit_i)
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
               ,0xaa);
  }
  if (iVar14 == -1) {
    local_420 = (long)_optind;
    uVar21 = argc - _optind;
    local_440 = argv + local_420;
    pkVar4 = kctx->stack->gcStack;
    local_428 = pkVar4->bytesize;
    local_478.m = (KGrowingArray *)0x5;
    uVar24 = 0;
    local_430 = (*kctx->klib->KClass_Generics)
                          (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0,1,
                           (kparamtype_t *)&local_478);
    local_438 = (*kctx->klib->new_kObject)(kctx,pkVar4,local_430,0);
    uVar23 = (ulong)uVar21;
    if ((int)uVar21 < 1) {
      uVar23 = uVar24;
    }
    for (; uVar23 != uVar24; uVar24 = uVar24 + 1) {
      p_Var5 = kctx->klib->new_kString;
      p_Var6 = kctx->klib->kArray_Add;
      pcVar15 = local_440[uVar24];
      sVar16 = strlen(pcVar15);
      pkVar17 = (*p_Var5)(kctx,pkVar4,pcVar15,sVar16,1);
      (*p_Var6)(kctx,(kArray *)local_438,pkVar17);
    }
    uVar23 = local_428 >> 3;
    local_478.m = (KGrowingArray *)0x1056b9;
    local_478.pos = (size_t)local_430->typeId;
    local_468 = local_438;
    local_460 = 0;
    uStack_458 = 0;
    local_450 = 0;
    p_Var7 = kctx->klib->kNameSpace_LoadConstData;
    pkVar18 = (kNameSpace *)
              (*kctx->klib->Knull)
                        (kctx,*(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58));
    (*p_Var7)(kctx,pkVar18,(char **)&local_478,&local_418);
    (*kctx->klib->kArray_Clear)(kctx,pkVar4,uVar23);
    if ((int)local_420 < argc) {
      Konoha_LoadScript(kctx,*local_440);
      if (interactive_flag != '\x01') goto LAB_00102b0c;
    }
    else {
      interactive_flag = '\x01';
      pkVar1 = &kctx->stack->flag;
      *pkVar1 = *pkVar1 | 2;
    }
    CommandLine_Import(kctx,"Konoha.Man",&local_418);
    (*kctx->platApi->printf_i)
              ("Konoha alpha 3.0 (%s) (%s, %lu, %s)\n","Rome","93e091e6",0x1082b,"Apr 27 2025");
    (*kctx->platApi->printf_i)
              ("[gcc %s]\n",
               "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
              );
    (*kctx->platApi->printf_i)("modules:");
    ShowModule(kctx,(kctx->platApi->ExecutionEngineModule).ExecutionEngineInfo);
    ShowModule(kctx,(kctx->platApi->GCModule).GCInfo);
    ShowModule(kctx,(kctx->platApi->ConsoleModule).ConsoleInfo);
    ShowModule(kctx,(kctx->platApi->EventModule).EventInfo);
    ShowModule(kctx,(kctx->platApi->I18NModule).I18NInfo);
    (*kctx->platApi->printf_i)("\n");
    (*kctx->klib->KBuffer_Init)(&kctx->stack->cwb,&local_478);
    kVar19 = (*kctx->klib->KfileId)(kctx,"(shell)",7,3,0xfffffffe);
    local_480 = kVar19 | 1;
LAB_001027e1:
    lVar22 = 0;
    uVar21 = 1;
    while( true ) {
      pcVar15 = "    ";
      if (uVar21 == 1) {
        pcVar15 = ">>> ";
      }
      pcVar15 = (*kctx->platApi->readline_i)(pcVar15);
      bVar25 = pcVar15 == (char *)0x0;
      if (bVar25) goto LAB_00102954;
      if (1 < uVar21) {
        (*kctx->klib->KBuffer_Write)(kctx,&local_478,"\n",1);
      }
      p_Var8 = kctx->klib->KBuffer_Write;
      sVar16 = strlen(pcVar15);
      (*p_Var8)(kctx,&local_478,pcVar15,sVar16);
      free(pcVar15);
      uVar24 = 0;
      pcVar15 = (*kctx->klib->KBuffer_text)(kctx,&local_478,0);
      uVar23 = (local_478.m)->bytesize;
      iVar14 = 0;
      while (uVar24 < uVar23 - local_478.pos) {
        bVar2 = pcVar15[uVar24];
        if (((bVar2 == 0x28) || (bVar2 == 0x7b)) || (bVar2 == 0x5b)) {
          iVar14 = iVar14 + 1;
        }
        if (((bVar2 == 0x29) || (bVar2 == 0x7d)) || (bVar2 == 0x5d)) {
          iVar14 = iVar14 + -1;
        }
        if (((bVar2 - 0x22 < 0x3f) &&
            ((0x4000000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)) &&
           ((pcVar15[uVar24 + 1] == bVar2 && (pcVar15[uVar24 + 2] == bVar2)))) {
          uVar24 = uVar24 + 2;
          if (uVar24 == 0) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/include/konoha3/libcode/minishell.h"
                          ,0x2e,"int CheckNode(const char *, size_t)");
          }
          while( true ) {
            if (uVar23 - local_478.pos <= uVar24) goto LAB_00102932;
            if ((((pcVar15[uVar24 - 1] != '\\') && (pcVar15[uVar24] == bVar2)) &&
                (pcVar15[uVar24 + 1] == bVar2)) && (pcVar15[uVar24 + 2] == bVar2)) break;
            uVar24 = uVar24 + 1;
          }
          uVar24 = uVar24 + 2;
        }
        else {
          uVar24 = uVar24 + 1;
        }
      }
      if (iVar14 < 1) break;
LAB_00102932:
      lVar22 = lVar22 + 1;
      uVar21 = uVar21 + 1;
    }
    if (iVar14 < 0) {
      (*kctx->platApi->printf_i)("(Cancelled)...\n");
LAB_00102954:
      (*kctx->klib->KBuffer_Free)(&local_478);
      uVar23 = (local_478.m)->bytesize;
    }
    else {
      bVar25 = false;
    }
    if (uVar23 != local_478.pos) {
      p_Var9 = kctx->platApi->add_history_i;
      pcVar15 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
      (*p_Var9)(pcVar15);
    }
    fflush(_stdout);
    if (!bVar25) {
      if ((local_478.m)->bytesize != local_478.pos) {
        pcVar15 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
        cVar13 = Konoha_Eval(kctx,pcVar15,local_480);
        local_480 = local_480 + lVar22 + 1;
        (*kctx->klib->KBuffer_Free)(&local_478);
        if (cVar13 != '\0') {
          pKVar10 = kctx->stack;
          if (pKVar10->evalty != 0) {
            pcVar15 = (kctx->share->classTable).field_1.bytebuf;
            ty = pKVar10->evalty & 0xfffffff;
            lVar22 = *(long *)(pcVar15 + (ulong)ty * 8);
            if ((*(byte *)(lVar22 + 100) & 2) == 0) {
              ty = (((pKVar10->stack[pKVar10->evalidx].field_0.asObject)->h).ct)->typeId & 0xfffffff
              ;
              lVar22 = *(long *)(pcVar15 + (ulong)ty * 8);
            }
            (**(code **)(lVar22 + 0x28))(kctx,pKVar10->stack + pKVar10->evalidx,0,&local_478);
            fflush(_stdout);
            p_Var11 = kctx->platApi->printf_i;
            pkVar17 = KType_GetString(kctx,ty);
            p_Var12 = ((pkVar17->h).ct)->unbox;
            pkVar17 = KType_GetString(kctx,ty);
            uVar20 = (*p_Var12)(kctx,(kObject_conflict *)pkVar17);
            pcVar15 = (*kctx->klib->KBuffer_text)(kctx,&local_478,1);
            (*p_Var11)("  (%s) %s\n",uVar20,pcVar15);
            pKVar10->evalty = 0;
          }
          (*kctx->klib->KBuffer_Free)(&local_478);
        }
      }
      goto LAB_001027e1;
    }
    (*kctx->klib->KBuffer_Free)(&local_478);
    (*kctx->platApi->printf_i)("\n");
  }
  else {
    kctx->platApi->exitStatus = 1;
  }
LAB_00102b0c:
  iVar14 = Konoha_Destroy(kctx);
  return iVar14;
}

Assistant:

int main(int argc, char *argv[])
{
	struct KonohaFactory factory = {};
	if(getenv("KONOHA_DEBUG") != NULL) {
		factory.verbose_debug = 1;
		factory.verbose_sugar = 1;
		factory.verbose_code = 1;
	}
	KonohaFactory_SetDefaultFactory(&factory, PosixFactory, argc, argv);
	KonohaContext* konoha = KonohaFactory_CreateKonoha(&factory);
	Konoha_ParseCommandOption(konoha, argc, argv);
	return Konoha_Destroy(konoha);
}